

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Production.h
# Opt level: O0

void __thiscall SGParser::Generator::Production::Production(Production *this,Production *source)

{
  Production *source_local;
  Production *this_local;
  
  std::__cxx11::string::string((string *)this);
  this->Id = 0;
  this->Precedence = 0;
  this->Left = 0;
  this->Length = 0;
  this->pRight = (uint *)0x0;
  this->Line = 0;
  this->NotReported = false;
  this->ErrorTerminal = 0;
  std::
  map<unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>_>
  ::map(&this->ReduceOverrides);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&this->LeftChain);
  std::
  map<unsigned_int,_SGParser::Generator::Production::ConflictAction,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_SGParser::Generator::Production::ConflictAction>_>_>
  ::map(&this->ConflictActions);
  this->pRight = (uint *)0x0;
  operator=(this,source);
  return;
}

Assistant:

Production(const Production& source) {
        pRight = nullptr;
        *this  = source;
    }